

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

void Dau_DsdTruthCompose_rec(word *pFunc,word (*pFanins) [64],word *pRes,int nVars,int nWordsR)

{
  byte bVar1;
  ulong uVar2;
  word *pwVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  word *pwVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  word *pwVar12;
  bool bVar13;
  word local_438 [64];
  word local_238 [65];
  
  pwVar12 = pFanins[nVars - 1];
  do {
    if (nVars < 7) {
      Dau_DsdTruth6Compose_rec(*pFunc,pFanins,pRes,nVars,nWordsR);
      return;
    }
    uVar11 = 1 << ((byte)(nVars + -6) & 0x1f);
    if ((int)uVar11 < 2) {
      __assert_fail("nWordsF > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                    ,0x1fe,"void Dau_DsdTruthCompose_rec(word *, word (*)[64], word *, int, int)");
    }
    uVar2 = (ulong)uVar11;
    lVar5 = 0;
    do {
      pwVar7 = pFunc + lVar5;
      if (*pwVar7 != 0) break;
      bVar13 = uVar2 - 1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar13);
    if (*pwVar7 == 0) {
      if (nWordsR < 1) {
        return;
      }
      iVar10 = 0;
LAB_004ffa13:
      memset(pRes,iVar10,(ulong)(uint)nWordsR << 3);
      return;
    }
    uVar6 = 0;
    while (pFunc[uVar6] == 0xffffffffffffffff) {
      uVar6 = uVar6 + 1;
      if (uVar2 == uVar6) {
        if (nWordsR < 1) {
          return;
        }
        iVar10 = 0xff;
        goto LAB_004ffa13;
      }
    }
    iVar10 = nVars + -1;
    if (nVars + -6 != 0x1f) {
      bVar1 = (byte)(nVars + -7);
      uVar8 = 1 << (bVar1 & 0x1f);
      iVar4 = 2 << (bVar1 & 0x1f);
      uVar6 = 1;
      if (1 < (int)uVar8) {
        uVar6 = (ulong)uVar8;
      }
      pwVar7 = pFunc + (int)uVar8;
      pwVar3 = pFunc;
      do {
        if (nVars + -7 != 0x1f) {
          uVar9 = 0;
          do {
            if (pwVar3[uVar9] != pwVar7[uVar9]) {
              Dau_DsdTruthCompose_rec(pFunc,pFanins,local_438,iVar10,nWordsR);
              Dau_DsdTruthCompose_rec(pFunc + (uVar11 >> 1),pFanins,local_238,iVar10,nWordsR);
              if (nWordsR < 1) {
                return;
              }
              uVar2 = 0;
              do {
                pRes[uVar2] = (local_238[uVar2] ^ local_438[uVar2]) & *pwVar12 ^ local_438[uVar2];
                uVar2 = uVar2 + 1;
                pwVar12 = pwVar12 + 1;
              } while ((uint)nWordsR != uVar2);
              return;
            }
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        pwVar3 = pwVar3 + iVar4;
        pwVar7 = pwVar7 + iVar4;
      } while (pwVar3 < pFunc + uVar2);
    }
    pwVar12 = pwVar12 + -0x40;
    nVars = iVar10;
  } while( true );
}

Assistant:

void Dau_DsdTruthCompose_rec( word * pFunc, word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], word * pRes, int nVars, int nWordsR )
{
    int nWordsF;
    if ( nVars <= 6 )
    {
        Dau_DsdTruth6Compose_rec( pFunc[0], pFanins, pRes, nVars, nWordsR );
        return;
    }
    nWordsF = Abc_TtWordNum( nVars );
    assert( nWordsF > 1 );
    if ( Abc_TtIsConst0(pFunc, nWordsF) )
    {
        Abc_TtConst0( pRes, nWordsR );
        return;
    }
    if ( Abc_TtIsConst1(pFunc, nWordsF) )
    {
        Abc_TtConst1( pRes, nWordsR );
        return;
    }
    if ( !Abc_TtHasVar( pFunc, nVars, nVars-1 ) )
    {
        Dau_DsdTruthCompose_rec( pFunc, pFanins, pRes, nVars-1, nWordsR );
        return;
    }
    {
        word pTtTemp[2][DAU_MAX_WORD];
        nVars--;
        Dau_DsdTruthCompose_rec( pFunc,             pFanins, pTtTemp[0], nVars, nWordsR );
        Dau_DsdTruthCompose_rec( pFunc + nWordsF/2, pFanins, pTtTemp[1], nVars, nWordsR );
        Abc_TtMux( pRes, pFanins[nVars], pTtTemp[1], pTtTemp[0], nWordsR );
        return;
    }
}